

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O1

void __thiscall
UnscentedKalmanFilter_updateStateCovariance_Test::~UnscentedKalmanFilter_updateStateCovariance_Test
          (UnscentedKalmanFilter_updateStateCovariance_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(UnscentedKalmanFilter, updateStateCovariance) {
    T alpha = 1, beta = 2, kappa = 1;
    
    auto ukf = UnscentedKalmanFilter<Vector<T, 3>>(alpha,beta,kappa);
    
    Matrix<T,2,2> P_yy;
    P_yy <<
        1, 0.1,
        0.1, 0.5;
    P_yy *= 0.1;
    
    // Setup Kalman Gain
    Matrix<T, 3, 2> K;
    K <<
        0.178408514951850, -0.304105423213381,
       -1.110998479472884,  0.802838317283324,
       -1.246156445345498,  0.063524243960128;
    
    // Setup P
    ukf.P.setIdentity();
    
    // Setup P_ref
    Matrix<T, 3, 3> P_ref;
    P_ref <<
        0.993278134696764,   0.027217594648895,   0.019295433443564,
        0.027217594648895,   0.862179812671265,  -0.130287401631777,
        0.019295433443564,  -0.130287401631777,   0.846090867814784;
    
    // Perform update
    bool success = ukf.updateStateCovariance<Vector<T,2>>(K, P_yy);
    ASSERT_TRUE(success);
    
    ASSERT_MATRIX_NEAR(P_ref, ukf.P, 1e-6);
}